

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

string * __thiscall
Assimp::Ogre::VertexElement::TypeToString_abi_cxx11_
          (string *__return_storage_ptr__,VertexElement *this,Type type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "FLOAT1";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "FLOAT2";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "FLOAT3";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "FLOAT4";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "COLOUR";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "SHORT1";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "SHORT2";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "SHORT3";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "SHORT4";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "UBYTE4";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "COLOUR_ARGB";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "COLOUR_ABGR";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "DOUBLE1";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "DOUBLE2";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "DOUBLE3";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = "DOUBLE4";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "USHORT1";
    pcVar1 = "";
    break;
  case 0x11:
    pcVar2 = "USHORT2";
    pcVar1 = "";
    break;
  case 0x12:
    pcVar2 = "USHORT3";
    pcVar1 = "";
    break;
  case 0x13:
    pcVar2 = "USHORT4";
    pcVar1 = "";
    break;
  case 0x14:
    pcVar2 = "INT1";
    pcVar1 = "";
    break;
  case 0x15:
    pcVar2 = "INT2";
    pcVar1 = "";
    break;
  case 0x16:
    pcVar2 = "INT3";
    pcVar1 = "";
    break;
  case 0x17:
    pcVar2 = "INT4";
    pcVar1 = "";
    break;
  case 0x18:
    pcVar2 = "UINT1";
    pcVar1 = "";
    break;
  case 0x19:
    pcVar2 = "UINT2";
    pcVar1 = "";
    break;
  case 0x1a:
    pcVar2 = "UINT3";
    pcVar1 = "";
    break;
  case 0x1b:
    pcVar2 = "UINT4";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Uknown_VertexElement::Type";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string VertexElement::TypeToString(Type type)
{
    switch(type)
    {
        case VET_COLOUR:        return "COLOUR";
        case VET_COLOUR_ABGR:   return "COLOUR_ABGR";
        case VET_COLOUR_ARGB:   return "COLOUR_ARGB";
        case VET_FLOAT1:        return "FLOAT1";
        case VET_FLOAT2:        return "FLOAT2";
        case VET_FLOAT3:        return "FLOAT3";
        case VET_FLOAT4:        return "FLOAT4";
        case VET_DOUBLE1:       return "DOUBLE1";
        case VET_DOUBLE2:       return "DOUBLE2";
        case VET_DOUBLE3:       return "DOUBLE3";
        case VET_DOUBLE4:       return "DOUBLE4";
        case VET_SHORT1:        return "SHORT1";
        case VET_SHORT2:        return "SHORT2";
        case VET_SHORT3:        return "SHORT3";
        case VET_SHORT4:        return "SHORT4";
        case VET_USHORT1:       return "USHORT1";
        case VET_USHORT2:       return "USHORT2";
        case VET_USHORT3:       return "USHORT3";
        case VET_USHORT4:       return "USHORT4";
        case VET_INT1:          return "INT1";
        case VET_INT2:          return "INT2";
        case VET_INT3:          return "INT3";
        case VET_INT4:          return "INT4";
        case VET_UINT1:         return "UINT1";
        case VET_UINT2:         return "UINT2";
        case VET_UINT3:         return "UINT3";
        case VET_UINT4:         return "UINT4";
        case VET_UBYTE4:        return "UBYTE4";
    }
    return "Uknown_VertexElement::Type";
}